

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

int64_t av1_block_error_qm(tran_low_t *coeff,tran_low_t *dqcoeff,intptr_t block_size,
                          qm_val_t *qmatrix,int16_t *scan,int64_t *ssz,int bd)

{
  int iVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  int64_t cc;
  int64_t dd;
  int64_t weight;
  int rounding;
  int shift;
  int64_t sqcoeff;
  int64_t error;
  int i;
  int64_t *ssz_local;
  int16_t *scan_local;
  qm_val_t *qmatrix_local;
  intptr_t block_size_local;
  tran_low_t *dqcoeff_local;
  tran_low_t *coeff_local;
  
  error = 0;
  sqcoeff = 0;
  bVar4 = ((char)bd + -8) * '\x02';
  iVar1 = (1 << (bVar4 & 0x1f)) >> 1;
  for (i = 0; i < block_size; i = i + 1) {
    lVar2 = (ulong)qmatrix[scan[i]] * (long)(coeff[i] - dqcoeff[i]);
    lVar3 = (ulong)qmatrix[scan[i]] * (long)coeff[i];
    error = (lVar2 * lVar2 + 0x200 >> 10) + error;
    sqcoeff = (lVar3 * lVar3 + 0x200 >> 10) + sqcoeff;
  }
  *ssz = sqcoeff + iVar1 >> (bVar4 & 0x3f);
  return error + iVar1 >> (bVar4 & 0x3f);
}

Assistant:

static inline int64_t av1_block_error_qm(
    const tran_low_t *coeff, const tran_low_t *dqcoeff, intptr_t block_size,
    const qm_val_t *qmatrix, const int16_t *scan, int64_t *ssz, int bd) {
  int i;
  int64_t error = 0, sqcoeff = 0;
  int shift = 2 * (bd - 8);
  int rounding = (1 << shift) >> 1;

  for (i = 0; i < block_size; i++) {
    int64_t weight = qmatrix[scan[i]];
    int64_t dd = coeff[i] - dqcoeff[i];
    dd *= weight;
    int64_t cc = coeff[i];
    cc *= weight;
    // The ranges of coeff and dqcoeff are
    //  bd8 : 18 bits (including sign)
    //  bd10: 20 bits (including sign)
    //  bd12: 22 bits (including sign)
    // As AOM_QM_BITS is 5, the intermediate quantities in the calculation
    // below should fit in 54 bits, thus no overflow should happen.
    error += (dd * dd + (1 << (2 * AOM_QM_BITS - 1))) >> (2 * AOM_QM_BITS);
    sqcoeff += (cc * cc + (1 << (2 * AOM_QM_BITS - 1))) >> (2 * AOM_QM_BITS);
  }

  error = (error + rounding) >> shift;
  sqcoeff = (sqcoeff + rounding) >> shift;

  *ssz = sqcoeff;
  return error;
}